

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_connection.hpp
# Opt level: O0

void __thiscall
cinatra::coro_http_connection::
coro_http_connection<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>>
          (coro_http_connection *this,
          ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>
          *executor,socket *socket,coro_http_router *router)

{
  allocator<char> *allocator;
  websocket *this_00;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  __i;
  undefined8 in_RCX;
  basic_streambuf<std::allocator<char>_> *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  size_type __n;
  vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *this_01;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  uint in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 uVar1;
  coro_http_connection *in_stack_ffffffffffffff20;
  http_parser *in_stack_ffffffffffffff28;
  coro_http_request *in_stack_ffffffffffffff30;
  allocator<char> *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  allocator<char> *maximum_size;
  allocator<char> local_35 [20];
  allocator<char> local_21;
  undefined8 local_20;
  undefined8 local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  std::enable_shared_from_this<cinatra::coro_http_connection>::enable_shared_from_this
            ((enable_shared_from_this<cinatra::coro_http_connection> *)0x267224);
  *(undefined8 *)(in_RDI + 0x10) = local_10;
  asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>::basic_stream_socket
            ((basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             (basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)
             CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  *(undefined8 *)(in_RDI + 0x70) = local_20;
  std::numeric_limits<unsigned_long>::max();
  std::allocator<char>::allocator();
  asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
            (in_RDX,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::allocator<char>::~allocator(&local_21);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff20);
  allocator = (allocator<char> *)std::numeric_limits<unsigned_long>::max();
  maximum_size = local_35;
  std::allocator<char>::allocator();
  asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
            (in_RDX,(size_t)maximum_size,allocator);
  std::allocator<char>::~allocator(local_35);
  http_parser::http_parser
            ((http_parser *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  coro_http_request::coro_http_request
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  coro_http_response::coro_http_response
            ((coro_http_response *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             (coro_http_connection *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::vector
            ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)0x2673a3);
  uVar1 = 0;
  std::atomic<bool>::atomic
            ((atomic<bool> *)(ulong)in_stack_ffffffffffffff10,(bool)in_stack_ffffffffffffff0f);
  *(undefined8 *)(in_RDI + 0x1068) = 0;
  std::function<void_(const_unsigned_long_&)>::function
            ((function<void_(const_unsigned_long_&)> *)CONCAT44(uVar1,in_stack_ffffffffffffff10),
             (nullptr_t)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  *(undefined1 *)(in_RDI + 0x1090) = 0;
  this_00 = (websocket *)(in_RDI + 0x1098);
  __i.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  std::
  atomic<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  ::atomic((atomic<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
            *)this_00,__i);
  *(undefined8 *)(in_RDI + 0x10a0) = 0x800000;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  websocket::websocket(this_00);
  *(undefined1 *)(in_RDI + 0x1100) = 0;
  *(undefined1 *)(in_RDI + 0x1101) = 1;
  __n = in_RDI + 0x1108;
  std::
  function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
  ::function((function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
              *)CONCAT44(uVar1,in_stack_ffffffffffffff10),
             (nullptr_t)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  this_01 = (vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)(in_RDI + 0x1128);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  *(undefined8 *)(in_RDI + 0x1168) = 0;
  std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::reserve(this_01,__n);
  return;
}

Assistant:

coro_http_connection(executor_t *executor, asio::ip::tcp::socket socket,
                       coro_http_router &router)
      : executor_(executor),
        socket_(std::move(socket)),
        router_(router),
        request_(parser_, this),
        response_(this) {
    buffers_.reserve(3);
  }